

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrenum.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::UStringEnumeration::snext(UStringEnumeration *this,UErrorCode *status)

{
  undefined8 in_RAX;
  UChar *srcChars;
  UnicodeString *pUVar1;
  int32_t length;
  int32_t local_14;
  
  local_14 = (int32_t)((ulong)in_RAX >> 0x20);
  srcChars = uenum_unext_63(this->uenum,&local_14,status);
  pUVar1 = (UnicodeString *)0x0;
  if ((srcChars != (UChar *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    pUVar1 = UnicodeString::setTo(&(this->super_StringEnumeration).unistr,srcChars,local_14);
  }
  return pUVar1;
}

Assistant:

const UnicodeString* UStringEnumeration::snext(UErrorCode& status) {
    int32_t length;
    const UChar* str = uenum_unext(uenum, &length, &status);
    if (str == 0 || U_FAILURE(status)) {
        return 0;
    }
    return &unistr.setTo(str, length);
}